

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> * __thiscall
google::protobuf::internal::cleanup::ChunkList::PeekForTesting
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,ChunkList *this)

{
  pointer *pppvVar1;
  iterator __position;
  CleanupNode *__args;
  Chunk *pCVar2;
  
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = this->head_;
  if (pCVar2 != (Chunk *)0x0) {
    __args = this->next_ + -1;
    while( true ) {
      for (; (CleanupNode *)(pCVar2 + 1) <= __args; __args = __args + -1) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                    ((vector<void*,std::allocator<void*>> *)__return_storage_ptr__,__position,
                     &__args->elem);
        }
        else {
          *__position._M_current = (Chunk *)__args->elem;
          pppvVar1 = &(__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppvVar1 = *pppvVar1 + 1;
        }
      }
      pCVar2 = pCVar2->next;
      if (pCVar2 == (Chunk *)0x0) break;
      __args = (CleanupNode *)((long)&pCVar2->next + (pCVar2->size - 0x10 & 0xfffffffffffffff0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<void*> ChunkList::PeekForTesting() {
  std::vector<void*> ret;
  Chunk* c = head_;
  if (c == nullptr) return ret;
  // Iterate backwards to match destruction order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    for (; it >= first; --it) {
      ret.push_back(it->elem);
    }
    c = c->next;
    if (c == nullptr) return ret;
    it = c->Last();
  };
}